

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimagescale_sse4.cpp
# Opt level: O1

void qt_qimageScaleAARGBA_down_xy_sse4<false>
               (QImageScaleInfo *isi,uint *dest,int dw,int dh,int dow,int sow)

{
  uint uVar1;
  int *piVar2;
  uint *puVar3;
  int *piVar4;
  uint *puVar5;
  int *piVar6;
  char cVar7;
  uint uVar8;
  int iVar9;
  QThreadPool *pQVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  uint *puVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint *puVar20;
  int iVar21;
  uint *puVar22;
  long in_FS_OFFSET;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar29;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar30;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar31 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar32 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar33 [16];
  int iVar35;
  undefined1 auVar34 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  anon_class_64_8_c6d6aeed scaleSection;
  int *yapoints;
  int *xapoints;
  int *xpoints;
  uint **ypoints;
  ulong local_108;
  int **local_b8;
  uint **ppuStack_b0;
  int *local_a8;
  int *piStack_a0;
  int **local_98;
  uint ***pppuStack_90;
  int **local_88;
  int *piStack_80;
  int *local_78;
  int *local_70;
  int *local_68;
  uint **local_60;
  int local_54;
  int local_50;
  int local_4c;
  uint *local_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppuStack_b0 = &local_48;
  piStack_a0 = &local_4c;
  local_a8 = &local_50;
  piStack_80 = &local_54;
  local_60 = isi->ypoints;
  pppuStack_90 = &local_60;
  local_68 = isi->xpoints;
  local_88 = &local_68;
  local_70 = isi->xapoints;
  local_98 = &local_70;
  local_78 = isi->yapoints;
  local_b8 = &local_78;
  lVar14 = (long)isi->sw * (long)isi->sh;
  lVar15 = lVar14 + 0xffff;
  if (-1 < lVar14) {
    lVar15 = lVar14;
  }
  iVar17 = (int)((ulong)lVar15 >> 0x10);
  if (dh <= iVar17) {
    iVar17 = dh;
  }
  local_54 = sow;
  local_50 = dow;
  local_4c = dw;
  local_48 = dest;
  pQVar10 = QGuiApplicationPrivate::qtGuiThreadPool();
  if ((pQVar10 != (QThreadPool *)0x0) && (1 < iVar17)) {
    QThread::currentThread();
    cVar7 = QThreadPool::contains((QThread *)pQVar10);
    if (cVar7 == '\0') {
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      iVar21 = 0;
      QSemaphore::QSemaphore((QSemaphore *)&local_40,0);
      do {
        iVar9 = (dh - iVar21) / iVar17;
        puVar11 = (undefined8 *)operator_new(0x18);
        *(undefined1 *)(puVar11 + 1) = 1;
        *puVar11 = QFactoryLoader::keyMap;
        puVar12 = (undefined8 *)operator_new(0x20);
        *puVar12 = QRunnable::QGenericRunnable::
                   Helper<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qimagescale_sse4.cpp:34:31)>
                   ::impl;
        *(int *)(puVar12 + 1) = iVar21;
        *(int *)((long)puVar12 + 0xc) = iVar9;
        puVar12[2] = &local_b8;
        puVar12[3] = &local_40;
        puVar11[2] = puVar12;
        QThreadPool::start((QRunnable *)pQVar10,(int)puVar11);
        iVar21 = iVar21 + iVar9;
        iVar17 = iVar17 + -1;
      } while (iVar17 != 0);
      QSemaphore::acquire((int)(QSemaphore *)&local_40);
      QSemaphore::~QSemaphore((QSemaphore *)&local_40);
      goto LAB_005bbb9e;
    }
  }
  if (0 < dh) {
    piVar2 = *local_b8;
    puVar3 = *ppuStack_b0;
    local_108 = 0;
    do {
      if (0 < *piStack_a0) {
        uVar1 = piVar2[local_108];
        uVar8 = uVar1 & 0xffff;
        iVar17 = (int)uVar1 >> 0x10;
        auVar23._4_4_ = iVar17;
        auVar23._0_4_ = iVar17;
        auVar23._8_4_ = iVar17;
        auVar23._12_4_ = iVar17;
        auVar24._0_8_ = CONCAT44(uVar1,uVar1) & 0xffff0000ffff;
        auVar24._8_4_ = uVar8;
        auVar24._12_4_ = uVar8;
        puVar22 = puVar3 + (long)*local_a8 * local_108;
        piVar4 = *local_98;
        puVar5 = (*pppuStack_90)[local_108];
        piVar6 = *local_88;
        iVar21 = 0x4000 - uVar8;
        lVar15 = 0;
        do {
          uVar1 = piVar4[lVar15];
          uVar8 = uVar1 & 0xffff;
          iVar18 = (int)uVar1 >> 0x10;
          auVar31._4_4_ = iVar18;
          auVar31._0_4_ = iVar18;
          auVar31._8_4_ = iVar18;
          auVar31._12_4_ = iVar18;
          auVar25._0_8_ = CONCAT44(uVar1,uVar1) & 0xffff0000ffff;
          auVar25._8_4_ = uVar8;
          auVar25._12_4_ = uVar8;
          puVar20 = puVar5 + piVar6[lVar15];
          auVar33 = pmovzxbd(in_XMM6,*puVar20);
          auVar33 = pmulld(auVar33,auVar25);
          iVar13 = 0x4000 - uVar8;
          puVar16 = puVar20;
          iVar9 = iVar13;
          while( true ) {
            iVar19 = auVar33._4_4_;
            iVar29 = auVar33._8_4_;
            iVar30 = auVar33._12_4_;
            if (iVar9 <= iVar18) break;
            auVar32 = pmovzxbd(in_XMM5,puVar16[1]);
            puVar16 = puVar16 + 1;
            in_XMM5 = pmaddwd(auVar32,auVar31);
            auVar33._0_4_ = auVar33._0_4_ + in_XMM5._0_4_;
            auVar33._4_4_ = iVar19 + in_XMM5._4_4_;
            auVar33._8_4_ = iVar29 + in_XMM5._8_4_;
            auVar33._12_4_ = iVar30 + in_XMM5._12_4_;
            iVar9 = iVar9 - iVar18;
          }
          in_XMM7 = pmovzxbd(in_XMM7,puVar16[1]);
          auVar32._4_4_ = iVar9;
          auVar32._0_4_ = iVar9;
          auVar32._8_4_ = iVar9;
          auVar32._12_4_ = iVar9;
          auVar32 = pmulld(auVar32,in_XMM7);
          auVar36._0_4_ = (uint)(auVar32._0_4_ + auVar33._0_4_) >> 4;
          auVar36._4_4_ = (uint)(auVar32._4_4_ + iVar19) >> 4;
          auVar36._8_4_ = (uint)(auVar32._8_4_ + iVar29) >> 4;
          auVar36._12_4_ = (uint)(auVar32._12_4_ + iVar30) >> 4;
          in_XMM5 = pmulld(auVar36,auVar24);
          iVar9 = iVar21;
          if (iVar17 < iVar21) {
            auVar32 = in_XMM5;
            do {
              puVar20 = puVar20 + *piStack_80;
              auVar33 = pmovzxbd(auVar33,*puVar20);
              auVar33 = pmulld(auVar33,auVar25);
              iVar19 = iVar13;
              puVar16 = puVar20;
              while( true ) {
                iVar29 = auVar33._4_4_;
                iVar30 = auVar33._8_4_;
                iVar35 = auVar33._12_4_;
                if (iVar19 <= iVar18) break;
                auVar36 = pmovzxbd(in_XMM7,puVar16[1]);
                puVar16 = puVar16 + 1;
                in_XMM7 = pmaddwd(auVar36,auVar31);
                auVar33._0_4_ = auVar33._0_4_ + in_XMM7._0_4_;
                auVar33._4_4_ = iVar29 + in_XMM7._4_4_;
                auVar33._8_4_ = iVar30 + in_XMM7._8_4_;
                auVar33._12_4_ = iVar35 + in_XMM7._12_4_;
                iVar19 = iVar19 - iVar18;
              }
              in_XMM7 = pmovzxbd(in_XMM7,puVar16[1]);
              auVar37._4_4_ = iVar19;
              auVar37._0_4_ = iVar19;
              auVar37._8_4_ = iVar19;
              auVar37._12_4_ = iVar19;
              auVar36 = pmulld(auVar37,in_XMM7);
              auVar38._0_4_ = (uint)(auVar36._0_4_ + auVar33._0_4_) >> 4;
              auVar38._4_4_ = (uint)(auVar36._4_4_ + iVar29) >> 4;
              auVar38._8_4_ = (uint)(auVar36._8_4_ + iVar30) >> 4;
              auVar38._12_4_ = (uint)(auVar36._12_4_ + iVar35) >> 4;
              auVar36 = pmulld(auVar38,auVar23);
              in_XMM5._0_4_ = auVar32._0_4_ + auVar36._0_4_;
              in_XMM5._4_4_ = auVar32._4_4_ + auVar36._4_4_;
              in_XMM5._8_4_ = auVar32._8_4_ + auVar36._8_4_;
              in_XMM5._12_4_ = auVar32._12_4_ + auVar36._12_4_;
              iVar9 = iVar9 - iVar17;
              auVar32 = in_XMM5;
            } while (iVar17 < iVar9);
          }
          puVar20 = puVar20 + *piStack_80;
          auVar33 = pmovzxbd(auVar33,*puVar20);
          auVar26 = pmulld(auVar25,auVar33);
          while( true ) {
            iVar19 = auVar26._4_4_;
            iVar30 = auVar26._12_4_;
            iVar29 = auVar26._8_4_;
            if (iVar13 <= iVar18) break;
            auVar33 = pmovzxbd(auVar33,puVar20[1]);
            puVar20 = puVar20 + 1;
            auVar33 = pmaddwd(auVar33,auVar31);
            auVar26._0_4_ = auVar26._0_4_ + auVar33._0_4_;
            auVar26._4_4_ = iVar19 + auVar33._4_4_;
            auVar26._8_4_ = iVar29 + auVar33._8_4_;
            auVar26._12_4_ = iVar30 + auVar33._12_4_;
            iVar13 = iVar13 - iVar18;
          }
          auVar33 = pmovzxbd(auVar31,puVar20[1]);
          auVar34._4_4_ = iVar13;
          auVar34._0_4_ = iVar13;
          auVar34._8_4_ = iVar13;
          auVar34._12_4_ = iVar13;
          auVar33 = pmulld(auVar34,auVar33);
          in_XMM6._0_4_ = (uint)(auVar33._0_4_ + auVar26._0_4_) >> 4;
          in_XMM6._4_4_ = (uint)(auVar33._4_4_ + iVar19) >> 4;
          in_XMM6._8_4_ = (uint)(auVar33._8_4_ + iVar29) >> 4;
          in_XMM6._12_4_ = (uint)(auVar33._12_4_ + iVar30) >> 4;
          auVar27._4_4_ = iVar9;
          auVar27._0_4_ = iVar9;
          auVar27._8_4_ = iVar9;
          auVar27._12_4_ = iVar9;
          auVar33 = pmulld(auVar27,in_XMM6);
          auVar28._0_4_ = auVar33._0_4_ + in_XMM5._0_4_;
          auVar28._4_4_ = auVar33._4_4_ + in_XMM5._4_4_;
          auVar28._8_4_ = auVar33._8_4_ + in_XMM5._8_4_;
          auVar28._12_4_ = auVar33._12_4_ + in_XMM5._12_4_;
          auVar33 = pshufb(auVar28,ZEXT416(0xf0b0703));
          *puVar22 = auVar33._0_4_;
          puVar22 = puVar22 + 1;
          lVar15 = lVar15 + 1;
        } while (lVar15 < *piStack_a0);
      }
      local_108 = local_108 + 1;
    } while (local_108 != (uint)dh);
  }
LAB_005bbb9e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void qt_qimageScaleAARGBA_down_xy_sse4(QImageScaleInfo *isi, unsigned int *dest,
                                       int dw, int dh, int dow, int sow)
{
    const unsigned int **ypoints = isi->ypoints;
    int *xpoints = isi->xpoints;
    int *xapoints = isi->xapoints;
    int *yapoints = isi->yapoints;

    auto scaleSection = [&] (int yStart, int yEnd) {
        for (int y = yStart; y < yEnd; ++y) {
            int Cy = yapoints[y] >> 16;
            int yap = yapoints[y] & 0xffff;
            const __m128i vCy = _mm_set1_epi32(Cy);
            const __m128i vyap = _mm_set1_epi32(yap);

            unsigned int *dptr = dest + (y * dow);
            for (int x = 0; x < dw; x++) {
                const int Cx = xapoints[x] >> 16;
                const int xap = xapoints[x] & 0xffff;
                const __m128i vCx = _mm_set1_epi32(Cx);
                const __m128i vxap = _mm_set1_epi32(xap);

                const unsigned int *sptr = ypoints[y] + xpoints[x];
                __m128i vx = qt_qimageScaleAARGBA_helper(sptr, xap, Cx, 1, vxap, vCx);
                __m128i vr = _mm_mullo_epi32(_mm_srli_epi32(vx, 4), vyap);

                int j;
                for (j = (1 << 14) - yap; j > Cy; j -= Cy) {
                    sptr += sow;
                    vx = qt_qimageScaleAARGBA_helper(sptr, xap, Cx, 1, vxap, vCx);
                    vr = _mm_add_epi32(vr, _mm_mullo_epi32(_mm_srli_epi32(vx, 4), vCy));
                }
                sptr += sow;
                vx = qt_qimageScaleAARGBA_helper(sptr, xap, Cx, 1, vxap, vCx);
                vr = _mm_add_epi32(vr, _mm_mullo_epi32(_mm_srli_epi32(vx, 4), _mm_set1_epi32(j)));

                vr = _mm_srli_epi32(vr, 24);
                vr = _mm_packus_epi32(vr, _mm_setzero_si128());
                vr = _mm_packus_epi16(vr, _mm_setzero_si128());
                *dptr = _mm_cvtsi128_si32(vr);
                if (RGB)
                    *dptr |= 0xff000000;
                dptr++;
            }
        }
    };
    multithread_pixels_function(isi, dh, scaleSection);
}